

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmTargetSelectLinker::Consider(cmTargetSelectLinker *this,string *lang)

{
  int iVar1;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar3;
  int preference;
  string *lang_local;
  cmTargetSelectLinker *this_local;
  
  iVar1 = cmGlobalGenerator::GetLinkerPreference(this->GG,lang);
  uVar2 = extraout_DL;
  uVar3 = extraout_var;
  if (this->Preference < iVar1) {
    this->Preference = iVar1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Preferred);
    uVar2 = extraout_DL_00;
    uVar3 = extraout_var_00;
  }
  if (iVar1 == this->Preference) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
              *)&this->Preferred,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)lang,(value_type *)CONCAT71(uVar3,uVar2));
  }
  return;
}

Assistant:

void Consider(const std::string& lang)
  {
    int preference = this->GG->GetLinkerPreference(lang);
    if (preference > this->Preference) {
      this->Preference = preference;
      this->Preferred.clear();
    }
    if (preference == this->Preference) {
      this->Preferred.insert(lang);
    }
  }